

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  ushort uVar1;
  ushort *puVar2;
  Context *context;
  OneofDescriptor *oneof;
  bool bVar3;
  byte bVar4;
  int iVar5;
  JavaType type;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar6;
  EnumDescriptor *descriptor;
  Descriptor *pDVar7;
  FieldDescriptor *pFVar8;
  ImmutableFieldGenerator *pIVar9;
  reference ppVar10;
  Printer *descriptor_00;
  char *pcVar11;
  Descriptor *descriptor_01;
  ulong uVar12;
  ulong extraout_RDX;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FieldDescriptor *field;
  AlphaNum *a_02;
  int j;
  int iVar13;
  int i;
  int iVar14;
  java *this_01;
  lts_20250127 *plVar15;
  Arg *a0;
  int i_1;
  iterator iVar16;
  string_view text;
  string_view varname;
  string_view varname_00;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view begin_varname;
  string_view text_07;
  string_view varname_01;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view begin_varname_00;
  string_view text_13;
  string_view varname_02;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string_view java_class_name;
  string_view end_varname;
  string_view end_varname_00;
  string_view text_22;
  string_view text_23;
  string_view format;
  string_view text_24;
  string_view text_25;
  string_view text_26;
  string_view text_27;
  string_view s;
  string_view s_00;
  string_view text_28;
  string_view text_29;
  string_view text_30;
  string_view s_01;
  string_view s_02;
  string_view text_31;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  ImmutableMessageGenerator messageGenerator;
  string_view local_138;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
  local_f0;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_e0;
  char *local_d8;
  string builder_type;
  string local_b0;
  iterator local_90;
  Options local_80;
  
  IsOwnFile<google::protobuf::Descriptor>((this->super_MessageGenerator).descriptor_,true);
  variables.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  variables.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  variables.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  pbVar6 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[7],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[7]> *)"static");
  std::__cxx11::string::assign((char *)pbVar6);
  puVar2 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  builder_type._M_dataplus._M_p = (pointer)(ulong)*puVar2;
  builder_type._M_string_length = (long)puVar2 + ~(ulong)builder_type._M_dataplus._M_p;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&messageGenerator,
             (basic_string_view<char,_std::char_traits<char>_> *)&builder_type,
             (allocator<char> *)&vars);
  pbVar6 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[10],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[10]> *)0xff9b1e);
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,
             descriptor_01);
  pbVar6 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[17],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[17]> *)"extra_interfaces");
  std::__cxx11::string::operator=((string *)pbVar6,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  pbVar6 = absl::lts_20250127::container_internal::
           raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
           ::
           operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                     ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                       *)&variables,(key_arg<char[12]> *)"deprecation");
  std::__cxx11::string::assign((char *)pbVar6);
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  Options::Options(&local_80,&this->context_->options_);
  WriteMessageDocComment(printer,pDVar7,&local_80,false);
  Options::~Options(&local_80);
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&messageGenerator,anon_var_dwarf_651463 + 5,(allocator<char> *)&builder_type)
  ;
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar7,true,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  if ((this->context_->options_).opensource_runtime == false) {
    text._M_str = "@com.google.protobuf.Internal.ProtoNonnullApi\n";
    text._M_len = 0x2e;
    io::Printer::Print<>(printer,text);
  }
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (((this->super_MessageGenerator).descriptor_)->extension_range_count_ < 1) {
    text_24._M_str = "$deprecation$public $static$final class $classname$ extends\n";
    text_24._M_len = 0x3c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&variables,text_24);
    a0 = (Arg *)0x0;
    varname_00._M_str = "classname";
    varname_00._M_len = 9;
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,varname_00,(this->super_MessageGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_25._M_str =
         "    com.google.protobuf.GeneratedMessage implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_25._M_len = 0x66;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&variables,text_25);
    std::__cxx11::string::assign((char *)&builder_type);
  }
  else {
    text_22._M_str = "$deprecation$public $static$final class $classname$ extends\n";
    text_22._M_len = 0x3c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&variables,text_22);
    a0 = (Arg *)0x0;
    varname._M_str = "classname";
    varname._M_len = 9;
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,varname,(this->super_MessageGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_23._M_str =
         "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n      $classname$> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
    ;
    text_23._M_len = 0x8c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&variables,text_23);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&local_138,this->name_resolver_,(this->super_MessageGenerator).descriptor_)
    ;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)local_138._M_str;
    messageGenerator.super_MessageGenerator.descriptor_ = (Descriptor *)local_138._M_len;
    format._M_str = (char *)&messageGenerator;
    format._M_len = (size_t)"com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>";
    absl::lts_20250127::Substitute_abi_cxx11_((string *)&vars,(lts_20250127 *)0x3d,format,a0);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&vars);
    std::__cxx11::string::~string((string *)&vars);
    std::__cxx11::string::~string((string *)&local_138);
  }
  text_00._M_str = "private static final long serialVersionUID = 0L;\n";
  text_00._M_len = 0x31;
  io::Printer::Print<>(printer,text_00);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_01._M_str = "static {\n";
  text_01._M_len = 9;
  io::Printer::Print<>(printer,text_01);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  puVar2 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  uVar1 = *puVar2;
  java_class_name._M_len = (long)puVar2 + ~(ulong)uVar1;
  java_class_name._M_str = (char *)a0;
  PrintGencodeVersionValidator
            ((java *)printer,(Printer *)(ulong)(this->context_->options_).opensource_runtime,
             SUB21(uVar1,0),java_class_name);
  io::Printer::Outdent(printer);
  text_02._M_str = "}\n";
  text_02._M_len = 2;
  io::Printer::Print<>(printer,text_02);
  puVar2 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)(ulong)*puVar2;
  messageGenerator.super_MessageGenerator.descriptor_ =
       (Descriptor *)
       ((long)puVar2 + ~(ulong)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  text_03._M_str =
       "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
  ;
  text_03._M_len = 0x6f;
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[12],std::__cxx11::string>
            (printer,text_03,(char (*) [10])0xff9b1e,
             (basic_string_view<char,_std::char_traits<char>_> *)&messageGenerator,
             (char (*) [12])"buildertype",&builder_type);
  puVar2 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator = (_func_int **)(ulong)*puVar2;
  messageGenerator.super_MessageGenerator.descriptor_ =
       (Descriptor *)
       ((long)puVar2 + ~(ulong)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  text_04._M_str = "private $classname$() {\n";
  text_04._M_len = 0x18;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_04,(char (*) [10])0xff9b1e,
             (basic_string_view<char,_std::char_traits<char>_> *)&messageGenerator);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  GenerateInitializers(this,printer);
  io::Printer::Outdent(printer);
  text_05._M_str = "}\n\n";
  text_05._M_len = 3;
  io::Printer::Print<>(printer,text_05);
  GenerateDescriptorMethods(this,printer);
  for (iVar13 = 0; pDVar7 = (this->super_MessageGenerator).descriptor_,
      iVar13 < pDVar7->enum_type_count_; iVar13 = iVar13 + 1) {
    descriptor = Descriptor::enum_type(pDVar7,iVar13);
    EnumNonLiteGenerator::EnumNonLiteGenerator
              ((EnumNonLiteGenerator *)&messageGenerator,descriptor,true,this->context_);
    EnumNonLiteGenerator::Generate((EnumNonLiteGenerator *)&messageGenerator,printer);
    EnumNonLiteGenerator::~EnumNonLiteGenerator((EnumNonLiteGenerator *)&messageGenerator);
  }
  for (iVar13 = 0; iVar13 < pDVar7->nested_type_count_; iVar13 = iVar13 + 1) {
    pDVar7 = Descriptor::nested_type(pDVar7,iVar13);
    if ((pDVar7->options_->field_0)._impl_.map_entry_ == false) {
      pDVar7 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,iVar13);
      ImmutableMessageGenerator(&messageGenerator,pDVar7,this->context_);
      GenerateInterface(&messageGenerator,printer);
      Generate(&messageGenerator,printer);
      ~ImmutableMessageGenerator(&messageGenerator);
    }
    pDVar7 = (this->super_MessageGenerator).descriptor_;
  }
  iVar13 = 0;
  for (iVar14 = 0; iVar14 < pDVar7->field_count_; iVar14 = iVar14 + 1) {
    pFVar8 = Descriptor::field(pDVar7,iVar14);
    pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,pFVar8);
    iVar5 = (*(pIVar9->super_FieldGenerator)._vptr_FieldGenerator[5])(pIVar9);
    iVar13 = iVar13 + iVar5;
    pDVar7 = (this->super_MessageGenerator).descriptor_;
  }
  iVar14 = (iVar13 + 0x1f) / 0x20;
  uVar12 = (long)(iVar13 + 0x1f) % 0x20 & 0xffffffff;
  this_01 = (java *)0x0;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  local_e0 = &this->field_generators_;
  for (; iVar14 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
    GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_01,(int)uVar12);
    text_06._M_str = "private int $bit_field_name$;\n";
    text_06._M_len = 0x1e;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_06,(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    uVar12 = extraout_RDX;
  }
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  vars.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  this_00 = &(this->super_MessageGenerator).oneofs_;
  iVar16 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
  local_f0.node_ =
       (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
        *)iVar16.node_;
  local_f0.position_ = iVar16.position_;
  iVar16 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
           ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00);
  local_90.node_ = iVar16.node_;
  local_90.position_ = iVar16.position_;
  while (bVar3 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator!=(&local_f0,&local_90), bVar3) {
    ppVar10 = absl::lts_20250127::container_internal::
              btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
              ::operator*(&local_f0);
    oneof = ppVar10->second;
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    pbVar6 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[11]> *)0xfd8e92);
    std::__cxx11::string::_M_assign((string *)pbVar6);
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    pbVar6 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[23],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[23]> *)"oneof_capitalized_name");
    std::__cxx11::string::_M_assign((string *)pbVar6);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)&messageGenerator,
               (int)(((long)oneof - (long)oneof->containing_type_->oneof_decls_) / 0x38));
    absl::lts_20250127::StrCat_abi_cxx11_((string *)&local_138,(lts_20250127 *)&messageGenerator,a);
    pbVar6 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[12],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[12]> *)"oneof_index");
    std::__cxx11::string::operator=((string *)pbVar6,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    pbVar6 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[2]> *)0xec9c5e);
    std::__cxx11::string::assign((char *)pbVar6);
    pbVar6 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[2],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[2]> *)0xed47f7);
    std::__cxx11::string::assign((char *)pbVar6);
    text_26._M_str =
         "private int $oneof_name$Case_ = 0;\n@SuppressWarnings(\"serial\")\nprivate java.lang.Object $oneof_name$_;\n"
    ;
    text_26._M_len = 0x67;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_26);
    text_27._M_str =
         "public enum ${$$oneof_capitalized_name$Case$}$\n    implements com.google.protobuf.Internal.EnumLite,\n        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n"
    ;
    text_27._M_len = 0xa5;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_27);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname,end_varname,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    descriptor_00 = printer;
    for (iVar13 = 0; iVar13 < oneof->field_count_; iVar13 = iVar13 + 1) {
      descriptor_00 = (Printer *)OneofDescriptor::field(oneof,iVar13);
      local_d8 = anon_var_dwarf_651463 + 5;
      if ((((FieldOptions *)
           ((anon_union_8_2_2904990b_for_scope_ *)&descriptor_00->options_)[2].containing_oneof)->
          field_0)._impl_.deprecated_ != false) {
        local_d8 = "@java.lang.Deprecated ";
      }
      puVar2 = (ushort *)((DescriptorNames *)&(descriptor_00->sink_).buffer_)->payload_;
      plVar15 = (lts_20250127 *)(ulong)*puVar2;
      s._M_len = (long)puVar2 + ~(ulong)plVar15;
      s._M_str = "@java.lang.Deprecated ";
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_((string *)&local_138,plVar15,s);
      absl::lts_20250127::AlphaNum::AlphaNum
                ((AlphaNum *)&messageGenerator,*(int *)((long)&(descriptor_00->sink_).stream_ + 4));
      absl::lts_20250127::StrCat_abi_cxx11_(&local_b0,(lts_20250127 *)&messageGenerator,a_00);
      text_07._M_str = "$deprecation$$field_name$($field_number$),\n";
      text_07._M_len = 0x2b;
      io::Printer::
      Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,text_07,(char (*) [12])"deprecation",&local_d8,(char (*) [11])0x1026cd3,
                 (string *)&local_138,(char (*) [13])0xfccc5b,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_138);
      varname_01._M_str = "field_name";
      varname_01._M_len = 10;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,varname_01,(FieldDescriptor *)descriptor_00,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    }
    pbVar6 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[11]> *)0xfd8e92);
    s_00._M_str = (char *)descriptor_00;
    s_00._M_len = (size_t)(pbVar6->_M_dataplus)._M_p;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
              ((string *)&messageGenerator,(lts_20250127 *)pbVar6->_M_string_length,s_00);
    text_08._M_str = "$cap_oneof_name$_NOT_SET(0);\n";
    text_08._M_len = 0x1d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_08,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    text_28._M_str =
         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
    ;
    text_28._M_len = 99;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_28);
    bVar4 = (this->context_->options_).opensource_runtime;
    if ((bool)bVar4 == true) {
      text_29._M_str =
           "/**\n * @param value The number of the enum to look for.\n * @return The enum associated with the given number.\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\n"
      ;
      text_29._M_len = 0x11a;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,&vars,text_29);
      bVar4 = (this->context_->options_).opensource_runtime;
    }
    if ((bVar4 & 1) == 0) {
      text_09._M_str = "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n";
      text_09._M_len = 0x37;
      io::Printer::Print<>(printer,text_09);
    }
    text_30._M_str =
         "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n";
    text_30._M_len = 0x55;
    pcVar11 = 
    "public static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n";
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_30);
    for (iVar13 = 0; iVar13 < oneof->field_count_; iVar13 = iVar13 + 1) {
      pFVar8 = OneofDescriptor::field(oneof,iVar13);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,pFVar8->number_);
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_138,(lts_20250127 *)&messageGenerator,a_01);
      puVar2 = (ushort *)(pFVar8->all_names_).payload_;
      plVar15 = (lts_20250127 *)(ulong)*puVar2;
      s_01._M_len = (long)puVar2 + ~(ulong)plVar15;
      s_01._M_str = pcVar11;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_b0,plVar15,s_01);
      pcVar11 = "field_number";
      text_10._M_str = "    case $field_number$: return $field_name$;\n";
      text_10._M_len = 0x2e;
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,text_10,(char (*) [13])0xfccc5b,(string *)&local_138,
                 (char (*) [11])0x1026cd3,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_138);
    }
    pbVar6 = absl::lts_20250127::container_internal::
             raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
             ::
             operator[]<char[11],absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
                       ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                         *)&vars,(key_arg<char[11]> *)0xfd8e92);
    s_02._M_str = pcVar11;
    s_02._M_len = (size_t)(pbVar6->_M_dataplus)._M_p;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
              ((string *)&messageGenerator,(lts_20250127 *)pbVar6->_M_string_length,s_02);
    text_11._M_str =
         "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
    ;
    text_11._M_len = 0x7d;
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,text_11,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    io::Printer::Outdent(printer);
    text_12._M_str = "};\n\n";
    text_12._M_len = 4;
    io::Printer::Print<>(printer,text_12);
    text_31._M_str =
         "public $oneof_capitalized_name$Case\n${$get$oneof_capitalized_name$Case$}$() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\n"
    ;
    text_31._M_len = 0x9c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&vars,text_31);
    begin_varname_00._M_str = "{";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "}";
    end_varname_00._M_len = 1;
    io::Printer::Annotate<google::protobuf::OneofDescriptor>
              (printer,begin_varname_00,end_varname_00,oneof,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    absl::lts_20250127::container_internal::
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
    ::increment(&local_f0);
  }
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  bVar3 = IsAnyMessage(pDVar7);
  if (bVar3) {
    GenerateAnyMethods((ImmutableMessageGenerator *)pDVar7,printer);
  }
  for (iVar13 = 0; pDVar7 = (this->super_MessageGenerator).descriptor_,
      iVar13 < pDVar7->field_count_; iVar13 = iVar13 + 1) {
    pFVar8 = Descriptor::field(pDVar7,iVar13);
    FieldConstantName_abi_cxx11_((string *)&local_138,(java *)pFVar8,field);
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar13);
    absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&messageGenerator,pFVar8->number_);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_b0,(lts_20250127 *)&messageGenerator,a_02);
    text_13._M_str = "public static final int $constant_name$ = $number$;\n";
    text_13._M_len = 0x34;
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,text_13,(char (*) [14])0x101d086,(string *)&local_138,(char (*) [7])0xe43eb3,
               &local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_138);
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar13);
    varname_02._M_str = "constant_name";
    varname_02._M_len = 0xd;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,varname_02,pFVar8,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,iVar13);
    pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (local_e0,pFVar8);
    (*(pIVar9->super_FieldGenerator)._vptr_FieldGenerator[8])(pIVar9,printer);
    text_14._M_str = "\n";
    text_14._M_len = 1;
    io::Printer::Print<>(printer,text_14);
  }
  bVar3 = Context::HasGeneratedMethods(this->context_,pDVar7);
  if (bVar3) {
    GenerateIsInitialized(this,printer);
    GenerateMessageSerializationMethods(this,printer);
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  pcVar11 = (((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)(ulong)*(ushort *)(pcVar11 + 2);
  messageGenerator.super_MessageGenerator.descriptor_ =
       (Descriptor *)
       (pcVar11 + ~(ulong)messageGenerator.super_MessageGenerator._vptr_MessageGenerator);
  text_15._M_str = "\n// @@protoc_insertion_point(class_scope:$full_name$)\n";
  text_15._M_len = 0x36;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_15,(char (*) [10])0x10a7999,
             (basic_string_view<char,_std::char_traits<char>_> *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_16._M_str = "private static final $classname$ DEFAULT_INSTANCE;\n";
  text_16._M_len = 0x33;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_16,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_17._M_str = "static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n";
  text_17._M_len = 0x34;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_17,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_18._M_str =
       "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n";
  text_18._M_len = 0x4f;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_18,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  bVar3 = IsWrappersProtoFile(((this->super_MessageGenerator).descriptor_)->file_);
  if (bVar3) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&messageGenerator,this->name_resolver_,
               (this->super_MessageGenerator).descriptor_);
    pFVar8 = Descriptor::field((this->super_MessageGenerator).descriptor_,0);
    type = GetJavaType(pFVar8);
    local_138 = PrimitiveTypeName(type);
    text_19._M_str =
         "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
    ;
    text_19._M_len = 0x65;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[11],std::basic_string_view<char,std::char_traits<char>>>
              (printer,text_19,(char (*) [10])0xff9b1e,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &messageGenerator,(char (*) [11])0x105544d,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_138);
    std::__cxx11::string::~string((string *)&messageGenerator);
  }
  GenerateParser(this,printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  text_20._M_str =
       "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
  ;
  text_20._M_len = 99;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_20,(char (*) [10])0xff9b1e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&messageGenerator)
  ;
  std::__cxx11::string::~string((string *)&messageGenerator);
  for (iVar13 = 0; pDVar7 = (this->super_MessageGenerator).descriptor_,
      iVar13 < pDVar7->extension_count_; iVar13 = iVar13 + 1) {
    pFVar8 = Descriptor::extension(pDVar7,iVar13);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&messageGenerator,pFVar8,this->context_);
    ImmutableExtensionGenerator::Generate((ImmutableExtensionGenerator *)&messageGenerator,printer);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)&messageGenerator);
  }
  io::Printer::Outdent(printer);
  text_21._M_str = "}\n\n";
  text_21._M_len = 3;
  io::Printer::Print<>(printer,text_21);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&vars);
  std::__cxx11::string::~string((string *)&builder_type);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&variables);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  absl::flat_hash_map<absl::string_view, std::string> variables;
  variables["static"] = is_own_file ? "" : "static ";
  variables["classname"] = std::string(descriptor_->name());
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_, context_->options());
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);
  if (!context_->options().opensource_runtime) {
    printer->Print("@com.google.protobuf.Internal.ProtoNonnullApi\n");
  }

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = absl::Substitute(
        "com.google.protobuf.GeneratedMessage.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type = "com.google.protobuf.GeneratedMessage.Builder<?>";
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();

  printer->Print("static {\n");
  printer->Indent();
  PrintGencodeVersionValidator(printer, context_->options().opensource_runtime,
                               descriptor_->name());
  printer->Outdent();
  printer->Print("}\n");

  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumNonLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  absl::flat_hash_map<absl::string_view, std::string> vars;
  for (const auto& kv : oneofs_) {
    const OneofDescriptor* oneof = kv.second;
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = absl::StrCat((oneof)->index());
    vars["{"] = "";
    vars["}"] = "";
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "@SuppressWarnings(\"serial\")\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum ${$$oneof_capitalized_name$Case$}$\n"
        // TODO: Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Annotate("{", "}", oneof);
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", absl::AsciiStrToUpper(field->name()), "field_number",
          absl::StrCat(field->number()));
      printer->Annotate("field_name", field);
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          vars,
          "/**\n"
          " * @param value The number of the enum to look for.\n"
          " * @return The enum associated with the given number.\n"
          " * @deprecated Use {@link #forNumber(int)} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
          "  return forNumber(value);\n"
          "}\n"
          "\n");
    }
    if (!context_->options().opensource_runtime) {
      printer->Print(
          "@com.google.protobuf.Internal.ProtoMethodMayReturnNull\n");
    }
    printer->Print(
        vars,
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", absl::StrCat(field->number()),
                     "field_name", absl::AsciiStrToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", absl::AsciiStrToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "${$get$oneof_capitalized_name$Case$}$() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
    printer->Annotate("{", "}", oneof);
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", absl::StrCat(descriptor_->field(i)->number()));
    printer->Annotate("constant_name", descriptor_->field(i));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}